

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_flbi.c
# Opt level: O0

void cmime_flbi_check_part_boundary(CMimePart_T *part)

{
  char *pcVar1;
  char *bound;
  CMimeHeader_T *h;
  CMimeListElem_T *e;
  CMimePart_T *part_local;
  
  h = (CMimeHeader_T *)part->headers->head;
  while( true ) {
    if (h == (CMimeHeader_T *)0x0) {
      return;
    }
    pcVar1 = cmime_header_get_value((CMimeHeader_T *)h->name,0);
    pcVar1 = cmime_flbi_get_boundary(pcVar1);
    if (pcVar1 != (char *)0x0) break;
    h = (CMimeHeader_T *)h->count;
  }
  part->boundary = pcVar1;
  return;
}

Assistant:

void cmime_flbi_check_part_boundary(CMimePart_T *part) {
    CMimeListElem_T *e = NULL;
    CMimeHeader_T *h = NULL;
    char *bound = NULL;

    e = cmime_list_head(part->headers);
    while(e != NULL) {
        h = (CMimeHeader_T *)cmime_list_data(e);

        bound = cmime_flbi_get_boundary(cmime_header_get_value(h,0));
        if (bound != NULL) {
            part->boundary = bound;
            break;
        }
        e = e->next;
    }
}